

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall cmCTest::Initialize(cmCTest *this,char *binary_dir,cmCTestStartCommand *command)

{
  char *pcVar1;
  char *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  ostream *poVar8;
  cmMakefile *this_00;
  tm *ptVar9;
  bool suppress;
  char cVar10;
  cmCTest *this_01;
  ios_base *this_02;
  int iVar11;
  string testingDir;
  string tag;
  string tagfile;
  int day;
  time_t tctime;
  auto_ptr<cmMakefile> mf;
  int min;
  int hour;
  int year;
  string tagmode;
  int mon;
  cmake cm;
  ifstream tfin;
  cmGlobalGenerator gg;
  undefined8 in_stack_fffffffffffff0a8;
  undefined4 uVar12;
  string local_f40;
  string local_f20;
  long *local_f00 [2];
  long local_ef0 [2];
  cmCTestStartCommand *local_ee0;
  string local_ed8;
  time_t local_eb8;
  auto_ptr<cmMakefile> local_eb0;
  undefined4 local_ea8;
  undefined4 local_ea4;
  undefined1 local_ea0 [112];
  ios_base local_e30 [264];
  undefined1 local_d28 [8];
  ulong local_d20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d18;
  byte abStack_d08 [80];
  ios_base local_cb8 [136];
  ios_base local_c30 [264];
  string local_b28 [3];
  undefined1 local_ac0 [632];
  cmState *local_848;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_840;
  size_type local_838;
  undefined1 local_808 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f8;
  byte abStack_7e8 [80];
  ios_base local_798 [416];
  undefined1 local_5f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8 [6];
  ios_base local_588 [1368];
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffff0a8 >> 0x20);
  if (command == (cmCTestStartCommand *)0x0) {
    suppress = false;
  }
  else {
    suppress = command->Quiet;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,"Here: ",6);
  plVar7 = (long *)std::ostream::operator<<(local_5f8,0x181);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x181,(char *)local_ac0._0_8_,suppress);
  pcVar1 = local_ac0 + 0x10;
  if ((char *)local_ac0._0_8_ != pcVar1) {
    operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
  this_01 = (cmCTest *)local_588;
  std::ios_base::~ios_base((ios_base *)this_01);
  local_ee0 = command;
  if (this->InteractiveDebugMode == false) {
    BlockTestErrorDiagnostics(this_01);
  }
  else {
    local_5f8._0_8_ = local_5e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_5f8,"CTEST_INTERACTIVE_DEBUG_MODE=1","");
    cmsys::SystemTools::PutEnv((string *)local_5f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._0_8_ != local_5e8) {
      operator_delete((void *)local_5f8._0_8_,local_5e8[0]._M_allocated_capacity + 1);
    }
  }
  pcVar2 = (char *)(this->BinaryDir)._M_string_length;
  strlen(binary_dir);
  std::__cxx11::string::_M_replace((ulong)&this->BinaryDir,0,pcVar2,(ulong)binary_dir);
  cmsys::SystemTools::ConvertToUnixSlashes(&this->BinaryDir);
  UpdateCTestConfiguration(this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,"Here: ",6);
  plVar7 = (long *)std::ostream::operator<<(local_5f8,0x18d);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x18d,(char *)local_ac0._0_8_,suppress);
  if ((char *)local_ac0._0_8_ != pcVar1) {
    operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
  std::ios_base::~ios_base(local_588);
  if (this->ProduceXML == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,"Here: ",6);
    plVar7 = (long *)std::ostream::operator<<(local_5f8,399);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        399,(char *)local_ac0._0_8_,suppress);
    if ((char *)local_ac0._0_8_ != pcVar1) {
      operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
    std::ios_base::~ios_base(local_588);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,"   Site: ",9);
    local_808._0_8_ = &local_7f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"Site","");
    GetCTestConfiguration((string *)local_ac0,this,(string *)local_808);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5f8,(char *)local_ac0._0_8_,local_ac0._8_8_);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"   Build name: ",0xf);
    local_b28[0]._M_dataplus._M_p = (pointer)&local_b28[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"BuildName","");
    GetCTestConfiguration((string *)local_ea0,this,local_b28);
    SafeBuildIdField((string *)local_d28,(string *)local_ea0);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_d28,local_d20);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if (local_d28 != (undefined1  [8])&local_d18) {
      operator_delete((void *)local_d28,
                      CONCAT71(local_d18._M_allocated_capacity._1_7_,local_d18._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_ea0._0_8_ != local_ea0 + 0x10) {
      operator_delete((void *)local_ea0._0_8_,local_ea0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b28[0]._M_dataplus._M_p != &local_b28[0].field_2) {
      operator_delete(local_b28[0]._M_dataplus._M_p,local_b28[0].field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_ac0._0_8_ != pcVar1) {
      operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._0_8_ != &local_7f8) {
      operator_delete((void *)local_808._0_8_,local_7f8._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x196,(char *)local_ac0._0_8_,suppress);
    if ((char *)local_ac0._0_8_ != pcVar1) {
      operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
    std::ios_base::~ios_base(local_588);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5f8,"Produce XML is on",0x11);
    std::ios::widen((char)(ostringstream *)local_5f8 +
                    (char)*(undefined8 *)(local_5f8._0_8_ + -0x18));
    std::ostream::put((char)local_5f8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x197,(char *)local_ac0._0_8_,suppress);
    if ((char *)local_ac0._0_8_ != pcVar1) {
      operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
    std::ios_base::~ios_base(local_588);
    if (this->TestModel == 1) {
      local_ac0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"NightlyStartTime","");
      GetCTestConfiguration((string *)local_5f8,this,(string *)local_ac0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._0_8_ != local_5e8) {
        operator_delete((void *)local_5f8._0_8_,local_5e8[0]._M_allocated_capacity + 1);
      }
      if ((char *)local_ac0._0_8_ != pcVar1) {
        operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
      }
      if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_5f8._8_8_ ==
          (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_5f8,
                   "WARNING: No nightly start time found please set in CTestConfig.cmake or DartConfig.cmake"
                   ,0x58);
        std::ios::widen((char)(ostringstream *)local_5f8 +
                        (char)*(undefined8 *)(local_5f8._0_8_ + -0x18));
        std::ostream::put((char)local_5f8);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,5,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x19f,(char *)local_ac0._0_8_,suppress);
        if ((char *)local_ac0._0_8_ != pcVar1) {
          operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
        std::ios_base::~ios_base(local_588);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,"Here: ",6);
        plVar7 = (long *)std::ostream::operator<<(local_5f8,0x1a0);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x1a1,(char *)local_ac0._0_8_,suppress);
        if ((char *)local_ac0._0_8_ != pcVar1) {
          operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
        std::ios_base::~ios_base(local_588);
        return 0;
      }
    }
  }
  cmake::cmake((cmake *)local_ac0,RoleScript);
  local_5f8._0_8_ = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"");
  cmake::SetHomeDirectory((cmake *)local_ac0,(string *)local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._0_8_ != local_5e8) {
    operator_delete((void *)local_5f8._0_8_,local_5e8[0]._M_allocated_capacity + 1);
  }
  local_5f8._0_8_ = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"");
  cmake::SetHomeOutputDirectory((cmake *)local_ac0,(string *)local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._0_8_ != local_5e8) {
    operator_delete((void *)local_5f8._0_8_,local_5e8[0]._M_allocated_capacity + 1);
  }
  local_5e8[0]._M_allocated_capacity = local_838;
  local_5f8._0_8_ = local_848;
  local_5f8._8_8_ = pcStack_840;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_5f8);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)local_5f8,(cmake *)local_ac0);
  this_00 = (cmMakefile *)operator_new(0x760);
  local_7f8._M_allocated_capacity = local_838;
  local_808._0_8_ = local_848;
  local_808._8_8_ = pcStack_840;
  cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)local_5f8,(cmStateSnapshot *)local_808);
  local_eb0.x_ = this_00;
  ReadCustomConfigurationFileTree(this,(this->BinaryDir)._M_dataplus._M_p,this_00);
  iVar11 = 1;
  if (this->ProduceXML != true) goto LAB_00285f41;
  pcVar3 = (this->BinaryDir)._M_dataplus._M_p;
  local_f40._M_dataplus._M_p = (pointer)&local_f40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f40,pcVar3,pcVar3 + (this->BinaryDir)._M_string_length);
  std::__cxx11::string::append((char *)&local_f40);
  bVar5 = cmsys::SystemTools::FileExists(local_f40._M_dataplus._M_p);
  if (bVar5) {
    bVar5 = cmsys::SystemTools::FileIsDirectory(&local_f40);
    if (bVar5) goto LAB_002851c6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_808);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_808,"File ",5);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_808,local_f40._M_dataplus._M_p,local_f40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," is in the place of the testing directory",0x29);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x1bd,(char *)local_d28,false);
LAB_0028527d:
    if (local_d28 != (undefined1  [8])&local_d18) {
      operator_delete((void *)local_d28,
                      CONCAT71(local_d18._M_allocated_capacity._1_7_,local_d18._M_local_buf[0]) + 1)
      ;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_808);
    std::ios_base::~ios_base(local_798);
  }
  else {
    bVar5 = cmsys::SystemTools::MakeDirectory(local_f40._M_dataplus._M_p);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_808);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_808,"Cannot create directory ",0x18);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_808,local_f40._M_dataplus._M_p,local_f40._M_string_length
                         );
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x1c3,(char *)local_d28,false);
      goto LAB_0028527d;
    }
LAB_002851c6:
    if (local_ee0 == (cmCTestStartCommand *)0x0) {
      cVar10 = '\x01';
    }
    else {
      cVar10 = local_ee0->CreateNewTag;
    }
    local_f00[0] = local_ef0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f00,local_f40._M_dataplus._M_p,
               local_f40._M_dataplus._M_p + local_f40._M_string_length);
    std::__cxx11::string::append((char *)local_f00);
    std::ifstream::ifstream(local_808,(char *)local_f00[0],_S_in);
    local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
    local_f20._M_string_length = 0;
    local_f20.field_2._M_local_buf[0] = '\0';
    if (cVar10 != '\0') {
      local_eb8 = time((time_t *)0x0);
      if (this->TomorrowTag == true) {
        local_eb8 = local_eb8 + 0x15180;
      }
      ptVar9 = gmtime(&local_eb8);
      if (((abStack_7e8[*(long *)(local_808._0_8_ + -0x18)] & 5) == 0) &&
         (bVar5 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)local_808,&local_f20,(bool *)0x0,-1), bVar5)) {
        local_ea0._0_8_ = local_ea0._0_8_ & 0xffffffff00000000;
        local_b28[0]._M_dataplus._M_p = local_b28[0]._M_dataplus._M_p & 0xffffffff00000000;
        local_ed8._M_dataplus._M_p._0_4_ = 0;
        local_ea4 = 0;
        uVar12 = (undefined4)((ulong)&local_ea8 >> 0x20);
        local_ea8 = 0;
        __isoc99_sscanf(local_f20._M_dataplus._M_p,"%04d%02d%02d-%02d%02d",local_ea0);
        if ((local_ea0._0_4_ != ptVar9->tm_year + 0x76c) ||
           (((int)local_b28[0]._M_dataplus._M_p != ptVar9->tm_mon + 1 ||
            ((int)local_ed8._M_dataplus._M_p != ptVar9->tm_mday)))) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_f20,0,(char *)local_f20._M_string_length,0x66eafa);
        }
        local_d20 = 0;
        local_d18._M_local_buf[0] = '\0';
        local_d28 = (undefined1  [8])&local_d18;
        bVar5 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)local_808,(string *)local_d28,(bool *)0x0,-1);
        if ((bVar5 && 4 < local_d20) && (this->Parts[0].Enabled == false)) {
          iVar6 = GetTestModelFromString((char *)local_d28);
          this->TestModel = iVar6;
        }
        std::ifstream::close();
        if (local_d28 != (undefined1  [8])&local_d18) {
          operator_delete((void *)local_d28,
                          CONCAT71(local_d18._M_allocated_capacity._1_7_,local_d18._M_local_buf[0])
                          + 1);
        }
      }
      if (((local_ee0 != (cmCTestStartCommand *)0x0) ||
          ((char *)local_f20._M_string_length == (char *)0x0)) || (this->Parts[0].Enabled == true))
      {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"TestModel: ",0xb);
        GetTestModelString_abi_cxx11_((string *)local_ea0,this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_d28,(char *)local_ea0._0_8_,local_ea0._8_8_);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pcVar1 = local_ea0 + 0x10;
        if ((char *)local_ea0._0_8_ != pcVar1) {
          operator_delete((void *)local_ea0._0_8_,local_ea0._16_8_ + 1);
        }
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x1f0,(char *)local_ea0._0_8_,suppress);
        if ((char *)local_ea0._0_8_ != pcVar1) {
          operator_delete((void *)local_ea0._0_8_,local_ea0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d28);
        std::ios_base::~ios_base(local_cb8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"TestModel: ",0xb);
        plVar7 = (long *)std::ostream::operator<<(local_d28,this->TestModel);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x1f2,(char *)local_ea0._0_8_,suppress);
        if ((char *)local_ea0._0_8_ != pcVar1) {
          operator_delete((void *)local_ea0._0_8_,local_ea0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d28);
        std::ios_base::~ios_base(local_cb8);
        if (this->TestModel == 1) {
          local_ea0._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_ea0,"NightlyStartTime","")
          ;
          GetCTestConfiguration((string *)local_d28,this,(string *)local_ea0);
          ptVar9 = (tm *)GetNightlyTime(this,(string *)local_d28,this->TomorrowTag);
          if (local_d28 != (undefined1  [8])&local_d18) {
            operator_delete((void *)local_d28,
                            CONCAT71(local_d18._M_allocated_capacity._1_7_,local_d18._M_local_buf[0]
                                    ) + 1);
          }
          if ((char *)local_ea0._0_8_ != pcVar1) {
            operator_delete((void *)local_ea0._0_8_,local_ea0._16_8_ + 1);
          }
        }
        sprintf((char *)local_b28,"%04d%02d%02d-%02d%02d",(ulong)(ptVar9->tm_year + 0x76c),
                (ulong)(ptVar9->tm_mon + 1),(ulong)(uint)ptVar9->tm_mday,
                (ulong)(uint)ptVar9->tm_hour,CONCAT44(uVar12,ptVar9->tm_min));
        sVar4 = local_f20._M_string_length;
        strlen((char *)local_b28);
        std::__cxx11::string::_M_replace((ulong)&local_f20,0,(char *)sVar4,(ulong)local_b28);
        std::ofstream::ofstream(local_d28,(char *)local_f00[0],_S_out);
        if ((abStack_d08[*(long *)((long)local_d28 + -0x18)] & 5) == 0) {
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_d28,local_f20._M_dataplus._M_p,
                              local_f20._M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          GetTestModelString_abi_cxx11_((string *)local_ea0,this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_d28,(char *)local_ea0._0_8_,local_ea0._8_8_);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if ((char *)local_ea0._0_8_ != pcVar1) {
            operator_delete((void *)local_ea0._0_8_,local_ea0._16_8_ + 1);
          }
        }
        std::ofstream::close();
        if (local_ee0 == (cmCTestStartCommand *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ea0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_ea0,"Create new tag: ",0x10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_ea0,local_f20._M_dataplus._M_p,
                              local_f20._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
          GetTestModelString_abi_cxx11_(&local_ed8,this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)CONCAT44(local_ed8._M_dataplus._M_p._4_4_,
                                                      (int)local_ed8._M_dataplus._M_p),
                              local_ed8._M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_ed8._M_dataplus._M_p._4_4_,(int)local_ed8._M_dataplus._M_p) !=
              &local_ed8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_ed8._M_dataplus._M_p._4_4_,
                                     (int)local_ed8._M_dataplus._M_p),
                            local_ed8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          Log(this,1,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x207,(char *)CONCAT44(local_ed8._M_dataplus._M_p._4_4_,
                                      (int)local_ed8._M_dataplus._M_p),suppress);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_ed8._M_dataplus._M_p._4_4_,(int)local_ed8._M_dataplus._M_p) !=
              &local_ed8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_ed8._M_dataplus._M_p._4_4_,
                                     (int)local_ed8._M_dataplus._M_p),
                            local_ed8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ea0);
          std::ios_base::~ios_base(local_e30);
        }
        local_d28 = (undefined1  [8])_VTT;
        *(undefined8 *)(local_d28 + *(long *)(_VTT->_M_local_buf + -0x18)) = _vtable;
        std::filebuf::~filebuf((filebuf *)&local_d20);
        this_02 = local_c30;
LAB_00285ecc:
        std::ios_base::~ios_base(this_02);
      }
      std::__cxx11::string::_M_assign((string *)&this->CurrentTag);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
        operator_delete(local_f20._M_dataplus._M_p,
                        CONCAT71(local_f20.field_2._M_allocated_capacity._1_7_,
                                 local_f20.field_2._M_local_buf[0]) + 1);
      }
      std::ifstream::~ifstream(local_808);
      if (local_f00[0] != local_ef0) {
        operator_delete(local_f00[0],local_ef0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f40._M_dataplus._M_p != &local_f40.field_2) {
        operator_delete(local_f40._M_dataplus._M_p,local_f40.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00285f41;
    }
    if ((abStack_7e8[*(long *)(local_808._0_8_ + -0x18)] & 5) == 0) {
      cmsys::SystemTools::GetLineFromStream((istream *)local_808,&local_f20,(bool *)0x0,-1);
      std::ifstream::close();
      if ((char *)local_f20._M_string_length != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_d28,"  Use existing tag: ",0x14);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_d28,local_f20._M_dataplus._M_p,
                            local_f20._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
        GetTestModelString_abi_cxx11_((string *)local_ea0,this);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_ea0._0_8_,local_ea0._8_8_);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if ((undefined1 *)local_ea0._0_8_ != local_ea0 + 0x10) {
          operator_delete((void *)local_ea0._0_8_,local_ea0._16_8_ + 1);
        }
        std::__cxx11::stringbuf::str();
        Log(this,1,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x219,(char *)local_ea0._0_8_,suppress);
        if ((undefined1 *)local_ea0._0_8_ != local_ea0 + 0x10) {
          operator_delete((void *)local_ea0._0_8_,local_ea0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d28);
        this_02 = local_cb8;
        goto LAB_00285ecc;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,"Cannot read existing TAG file in ",0x21);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_d28,local_f40._M_dataplus._M_p,local_f40._M_string_length);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x212,(char *)local_ea0._0_8_,false);
    if ((undefined1 *)local_ea0._0_8_ != local_ea0 + 0x10) {
      operator_delete((void *)local_ea0._0_8_,local_ea0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d28);
    std::ios_base::~ios_base(local_cb8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
      operator_delete(local_f20._M_dataplus._M_p,
                      CONCAT71(local_f20.field_2._M_allocated_capacity._1_7_,
                               local_f20.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(local_808);
    if (local_f00[0] != local_ef0) {
      operator_delete(local_f00[0],local_ef0[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f40._M_dataplus._M_p != &local_f40.field_2) {
    operator_delete(local_f40._M_dataplus._M_p,local_f40.field_2._M_allocated_capacity + 1);
  }
  iVar11 = 0;
LAB_00285f41:
  ::cm::auto_ptr<cmMakefile>::~auto_ptr(&local_eb0);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)local_5f8);
  cmake::~cmake((cmake *)local_ac0);
  return iVar11;
}

Assistant:

int cmCTest::Initialize(const char* binary_dir, cmCTestStartCommand* command)
{
  bool quiet = false;
  if (command && command->ShouldBeQuiet()) {
    quiet = true;
  }

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (!this->InteractiveDebugMode) {
    this->BlockTestErrorDiagnostics();
  } else {
    cmSystemTools::PutEnv("CTEST_INTERACTIVE_DEBUG_MODE=1");
  }

  this->BinaryDir = binary_dir;
  cmSystemTools::ConvertToUnixSlashes(this->BinaryDir);

  this->UpdateCTestConfiguration();

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (this->ProduceXML) {
    cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
    cmCTestOptionalLog(
      this, OUTPUT, "   Site: "
        << this->GetCTestConfiguration("Site") << std::endl
        << "   Build name: "
        << cmCTest::SafeBuildIdField(this->GetCTestConfiguration("BuildName"))
        << std::endl,
      quiet);
    cmCTestOptionalLog(this, DEBUG, "Produce XML is on" << std::endl, quiet);
    if (this->TestModel == cmCTest::NIGHTLY &&
        this->GetCTestConfiguration("NightlyStartTime").empty()) {
      cmCTestOptionalLog(
        this, WARNING,
        "WARNING: No nightly start time found please set in CTestConfig.cmake"
        " or DartConfig.cmake"
          << std::endl,
        quiet);
      cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl,
                         quiet);
      return 0;
    }
  }

  cmake cm(cmake::RoleScript);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(&gg, cm.GetCurrentSnapshot()));
  if (!this->ReadCustomConfigurationFileTree(this->BinaryDir.c_str(),
                                             mf.get())) {
    cmCTestOptionalLog(
      this, DEBUG, "Cannot find custom configuration file tree" << std::endl,
      quiet);
    return 0;
  }

  if (this->ProduceXML) {
    // Verify "Testing" directory exists:
    //
    std::string testingDir = this->BinaryDir + "/Testing";
    if (cmSystemTools::FileExists(testingDir.c_str())) {
      if (!cmSystemTools::FileIsDirectory(testingDir)) {
        cmCTestLog(this, ERROR_MESSAGE, "File "
                     << testingDir
                     << " is in the place of the testing directory"
                     << std::endl);
        return 0;
      }
    } else {
      if (!cmSystemTools::MakeDirectory(testingDir.c_str())) {
        cmCTestLog(this, ERROR_MESSAGE, "Cannot create directory "
                     << testingDir << std::endl);
        return 0;
      }
    }

    // Create new "TAG" file or read existing one:
    //
    bool createNewTag = true;
    if (command) {
      createNewTag = command->ShouldCreateNewTag();
    }

    std::string tagfile = testingDir + "/TAG";
    cmsys::ifstream tfin(tagfile.c_str());
    std::string tag;

    if (createNewTag) {
      time_t tctime = time(CM_NULLPTR);
      if (this->TomorrowTag) {
        tctime += (24 * 60 * 60);
      }
      struct tm* lctime = gmtime(&tctime);
      if (tfin && cmSystemTools::GetLineFromStream(tfin, tag)) {
        int year = 0;
        int mon = 0;
        int day = 0;
        int hour = 0;
        int min = 0;
        sscanf(tag.c_str(), "%04d%02d%02d-%02d%02d", &year, &mon, &day, &hour,
               &min);
        if (year != lctime->tm_year + 1900 || mon != lctime->tm_mon + 1 ||
            day != lctime->tm_mday) {
          tag = "";
        }
        std::string tagmode;
        if (cmSystemTools::GetLineFromStream(tfin, tagmode)) {
          if (tagmode.size() > 4 && !this->Parts[PartStart]) {
            this->TestModel = cmCTest::GetTestModelFromString(tagmode.c_str());
          }
        }
        tfin.close();
      }
      if (tag.empty() || (CM_NULLPTR != command) || this->Parts[PartStart]) {
        cmCTestOptionalLog(
          this, DEBUG,
          "TestModel: " << this->GetTestModelString() << std::endl, quiet);
        cmCTestOptionalLog(
          this, DEBUG, "TestModel: " << this->TestModel << std::endl, quiet);
        if (this->TestModel == cmCTest::NIGHTLY) {
          lctime = this->GetNightlyTime(
            this->GetCTestConfiguration("NightlyStartTime"),
            this->TomorrowTag);
        }
        char datestring[100];
        sprintf(datestring, "%04d%02d%02d-%02d%02d", lctime->tm_year + 1900,
                lctime->tm_mon + 1, lctime->tm_mday, lctime->tm_hour,
                lctime->tm_min);
        tag = datestring;
        cmsys::ofstream ofs(tagfile.c_str());
        if (ofs) {
          ofs << tag << std::endl;
          ofs << this->GetTestModelString() << std::endl;
        }
        ofs.close();
        if (CM_NULLPTR == command) {
          cmCTestOptionalLog(this, OUTPUT, "Create new tag: "
                               << tag << " - " << this->GetTestModelString()
                               << std::endl,
                             quiet);
        }
      }
    } else {
      if (tfin) {
        cmSystemTools::GetLineFromStream(tfin, tag);
        tfin.close();
      }

      if (tag.empty()) {
        cmCTestLog(this, ERROR_MESSAGE, "Cannot read existing TAG file in "
                     << testingDir << std::endl);
        return 0;
      }

      cmCTestOptionalLog(this, OUTPUT, "  Use existing tag: "
                           << tag << " - " << this->GetTestModelString()
                           << std::endl,
                         quiet);
    }

    this->CurrentTag = tag;
  }

  return 1;
}